

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

Rfn_Obj_t * Gla_ObjRef(Gla_Man_t *p,Gia_Obj_t *pObj,int f)

{
  Gla_Obj_t *pGVar1;
  uint in_ECX;
  int Fill;
  undefined4 in_register_00000014;
  Gla_Obj_t *pGVar2;
  Vec_Int_t *p_00;
  
  pGVar2 = (Gla_Obj_t *)CONCAT44(in_register_00000014,f);
  pGVar1 = p->pObjRoot;
  if ((pGVar2 < pGVar1) ||
     ((Gla_Obj_t *)(pGVar1->Fanins + (long)*(int *)&p->vAbs * 3 + -2) <= pGVar2)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  Fill = (int)((ulong)((long)pGVar2 - (long)pGVar1) >> 2);
  p_00 = (Vec_Int_t *)((long)pObj + (long)(Fill * -0x55555555) * 0x10);
  Vec_IntFillExtra(p_00,in_ECX + 1,Fill);
  if ((-1 < (int)in_ECX) && ((int)in_ECX < p_00->nSize)) {
    return (Rfn_Obj_t *)(p_00->pArray + in_ECX);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline Rfn_Obj_t * Gla_ObjRef( Gla_Man_t * p, Gia_Obj_t * pObj, int f ) { return (Rfn_Obj_t *)Vec_IntGetEntryP( &(p->pvRefis[Gia_ObjId(p->pGia, pObj)]), f ); }